

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O3

void __thiscall
Lib::DArray<Kernel::Clause_*>::DArray(DArray<Kernel::Clause_*> *this,DArray<Kernel::Clause_*> *o)

{
  size_t sVar1;
  Clause **ppCVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar1 = o->_size;
  this->_size = sVar1;
  this->_capacity = sVar1;
  if (sVar1 == 0) {
    this->_array = (Clause **)0x0;
  }
  else {
    uVar4 = sVar1 * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      ppCVar2 = (Clause **)
                FixedSizeAllocator<8UL>::alloc
                          ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar4 < 0x11) {
      ppCVar2 = (Clause **)
                FixedSizeAllocator<16UL>::alloc
                          ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar4 < 0x19) {
      ppCVar2 = (Clause **)
                FixedSizeAllocator<24UL>::alloc
                          ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar4 < 0x21) {
      ppCVar2 = (Clause **)
                FixedSizeAllocator<32UL>::alloc
                          ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar4 < 0x31) {
      ppCVar2 = (Clause **)
                FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar4 < 0x41) {
      ppCVar2 = (Clause **)
                FixedSizeAllocator<64UL>::alloc
                          ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      ppCVar2 = (Clause **)::operator_new(uVar4,0x10);
    }
    this->_array = ppCVar2;
    sVar1 = this->_size;
    if (sVar1 != 0) {
      sVar3 = 0;
      do {
        this->_array[sVar3] = o->_array[sVar3];
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
  }
  return;
}

Assistant:

explicit DArray(const DArray& o)
    : _size(o.size()), _capacity(o.size())
  {
    if(_size==0) {
      _array=0;
      return;
    }
    void* mem = ALLOC_KNOWN(sizeof(C)*_capacity,"DArray<>");
    _array = static_cast<C*>(mem);
    for(size_t i=0; i<_size; i++) {
      ::new (&_array[i]) C(o[i]);
    }
  }